

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-stats.cc
# Opt level: O0

Result __thiscall
wabt::(anonymous_namespace)::BinaryReaderOpcnt::
Emplace<wabt::Opcode&,wabt::OpcodeInfo::Kind,unsigned_long*>
          (BinaryReaderOpcnt *this,Opcode *args,Kind *args_1,unsigned_long **args_2)

{
  map<wabt::OpcodeInfo,unsigned_long,std::less<wabt::OpcodeInfo>,std::allocator<std::pair<wabt::OpcodeInfo_const,unsigned_long>>>
  *this_00;
  pointer ppVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_wabt::OpcodeInfo,_unsigned_long>_>,_bool> pVar2;
  unsigned_long *count;
  tuple<int> local_54;
  tuple<wabt::Opcode,_wabt::OpcodeInfo::Kind,_unsigned_long_*> local_50;
  _Rb_tree_iterator<std::pair<const_wabt::OpcodeInfo,_unsigned_long>_> local_40;
  pair<std::_Rb_tree_iterator<std::pair<const_wabt::OpcodeInfo,_unsigned_long>_>,_bool> pair;
  unsigned_long **args_local_2;
  Kind *args_local_1;
  Opcode *args_local;
  BinaryReaderOpcnt *this_local;
  
  this_00 = *(map<wabt::OpcodeInfo,unsigned_long,std::less<wabt::OpcodeInfo>,std::allocator<std::pair<wabt::OpcodeInfo_const,unsigned_long>>>
              **)(this + 0x10);
  pair._8_8_ = args_2;
  std::make_tuple<wabt::Opcode&,wabt::OpcodeInfo::Kind,unsigned_long*>(&local_50,args,args_1,args_2)
  ;
  std::make_tuple<int>((int *)&local_54);
  pVar2 = std::
          map<wabt::OpcodeInfo,unsigned_long,std::less<wabt::OpcodeInfo>,std::allocator<std::pair<wabt::OpcodeInfo_const,unsigned_long>>>
          ::
          emplace<std::piecewise_construct_t_const&,std::tuple<wabt::Opcode,wabt::OpcodeInfo::Kind,unsigned_long*>,std::tuple<int>>
                    (this_00,(piecewise_construct_t *)&std::piecewise_construct,&local_50,&local_54)
  ;
  local_40 = pVar2.first._M_node;
  pair.first._M_node._0_1_ = pVar2.second;
  ppVar1 = std::_Rb_tree_iterator<std::pair<const_wabt::OpcodeInfo,_unsigned_long>_>::operator->
                     (&local_40);
  ppVar1->second = ppVar1->second + 1;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderOpcnt::Emplace(Args&&... args) {
  auto pair = opcode_counts_->emplace(
      std::piecewise_construct, std::make_tuple(std::forward<Args>(args)...),
      std::make_tuple(0));

  auto& count = pair.first->second;
  count++;
  return Result::Ok;
}